

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qemulationpaintengine.cpp
# Opt level: O0

void __thiscall QEmulationPaintEngine::fillBGRect(QEmulationPaintEngine *this,QRectF *r)

{
  QPaintEngineEx *pQVar1;
  qreal qVar2;
  qreal qVar3;
  QPainterState *pQVar4;
  QRectF *in_RSI;
  QEmulationPaintEngine *in_RDI;
  long in_FS_OFFSET;
  QVectorPath vp;
  qreal pts [8];
  QVectorPath *this_00;
  undefined1 local_88 [24];
  qreal qStack_70;
  qreal local_68;
  qreal qStack_60;
  qreal local_58;
  CacheEntry *pCStack_50;
  qreal local_48;
  qreal qStack_40;
  double local_38;
  qreal qStack_30;
  double local_28;
  double dStack_20;
  qreal local_18;
  double dStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = -NAN;
  dStack_10 = -NAN;
  local_28 = -NAN;
  dStack_20 = -NAN;
  local_38 = -NAN;
  qStack_30 = -NAN;
  local_48 = -NAN;
  qStack_40 = -NAN;
  local_48 = QRectF::x(in_RSI);
  qStack_40 = QRectF::y(in_RSI);
  qVar2 = QRectF::x(in_RSI);
  qVar3 = QRectF::width(in_RSI);
  local_38 = qVar2 + qVar3;
  qStack_30 = QRectF::y(in_RSI);
  qVar2 = QRectF::x(in_RSI);
  qVar3 = QRectF::width(in_RSI);
  local_28 = qVar2 + qVar3;
  this_00 = (QVectorPath *)QRectF::y(in_RSI);
  qVar2 = QRectF::height(in_RSI);
  dStack_20 = (double)this_00 + qVar2;
  local_18 = QRectF::x(in_RSI);
  qVar2 = QRectF::y(in_RSI);
  qVar3 = QRectF::height(in_RSI);
  dStack_10 = qVar2 + qVar3;
  local_58 = -NAN;
  pCStack_50 = (CacheEntry *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = -NAN;
  qStack_60 = -NAN;
  local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  qStack_70 = -NAN;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVectorPath::QVectorPath((QVectorPath *)local_88,&local_48,4,(ElementType *)0x0,0x11);
  pQVar1 = in_RDI->real_engine;
  pQVar4 = state(in_RDI);
  (*(pQVar1->super_QPaintEngine)._vptr_QPaintEngine[0x1a])
            (pQVar1,(QVectorPath *)local_88,&pQVar4->bgBrush);
  QVectorPath::~QVectorPath(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEmulationPaintEngine::fillBGRect(const QRectF &r)
{
    qreal pts[] = { r.x(), r.y(), r.x() + r.width(), r.y(),
                    r.x() + r.width(), r.y() + r.height(), r.x(), r.y() + r.height() };
    QVectorPath vp(pts, 4, nullptr, QVectorPath::RectangleHint);
    real_engine->fill(vp, state()->bgBrush);
}